

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QStaticTextPrivate>::reset
          (QExplicitlySharedDataPointer<QStaticTextPrivate> *this,QStaticTextPrivate *ptr)

{
  long lVar1;
  bool bVar2;
  QStaticTextPrivate *pQVar3;
  QStaticTextPrivate *in_RSI;
  long in_FS_OFFSET;
  QStaticTextPrivate *old;
  totally_ordered_wrapper<QStaticTextPrivate_*> *in_stack_ffffffffffffffb8;
  QStaticTextPrivate **in_stack_ffffffffffffffc0;
  totally_ordered_wrapper<QStaticTextPrivate_*> local_20;
  totally_ordered_wrapper<QStaticTextPrivate_*> local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Qt::operator!=<QStaticTextPrivate_*,_true>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar2) {
    if (in_RSI != (QStaticTextPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x799f3f);
    }
    Qt::totally_ordered_wrapper<QStaticTextPrivate_*>::totally_ordered_wrapper(&local_20,in_RSI);
    local_18 = std::
               exchange<Qt::totally_ordered_wrapper<QStaticTextPrivate*>,Qt::totally_ordered_wrapper<QStaticTextPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QStaticTextPrivate_*> *)0x799f5d);
    pQVar3 = Qt::totally_ordered_wrapper<QStaticTextPrivate_*>::get(&local_18);
    if (((pQVar3 != (QStaticTextPrivate *)0x0) &&
        (bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x799f83), !bVar2)) &&
       (pQVar3 != (QStaticTextPrivate *)0x0)) {
      QStaticTextPrivate::~QStaticTextPrivate(in_RSI);
      operator_delete(pQVar3,0xe8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }